

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O3

PipelineCreateInfo * __thiscall
vkt::Draw::PipelineCreateInfo::addState
          (PipelineCreateInfo *this,VkPipelineDynamicStateCreateInfo *state)

{
  pointer pVVar1;
  pointer pVVar2;
  void *pvVar3;
  deUint32 dVar4;
  undefined4 uVar5;
  allocator_type local_39;
  pointer local_38;
  pointer pVStack_30;
  pointer local_28;
  
  std::vector<vk::VkDynamicState,std::allocator<vk::VkDynamicState>>::
  vector<vk::VkDynamicState_const*,void>
            ((vector<vk::VkDynamicState,std::allocator<vk::VkDynamicState>> *)&local_38,
             state->pDynamicStates,state->pDynamicStates + state->dynamicStateCount,&local_39);
  pVVar1 = (this->m_dynamicStates).
           super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2 = (this->m_dynamicStates).
           super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->m_dynamicStates).
  super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>._M_impl.
  super__Vector_impl_data._M_start = local_38;
  (this->m_dynamicStates).
  super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>._M_impl.
  super__Vector_impl_data._M_finish = pVStack_30;
  (this->m_dynamicStates).
  super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_28;
  local_38 = (pointer)0x0;
  pVStack_30 = (pointer)0x0;
  local_28 = (pointer)0x0;
  if (pVVar1 != (pointer)0x0) {
    operator_delete(pVVar1,(long)pVVar2 - (long)pVVar1);
    if (local_38 != (pointer)0x0) {
      operator_delete(local_38,(long)local_28 - (long)local_38);
    }
  }
  dVar4 = state->dynamicStateCount;
  (this->m_dynamicState).flags = state->flags;
  (this->m_dynamicState).dynamicStateCount = dVar4;
  uVar5 = *(undefined4 *)&state->field_0x4;
  pvVar3 = state->pNext;
  (this->m_dynamicState).sType = state->sType;
  *(undefined4 *)&(this->m_dynamicState).field_0x4 = uVar5;
  (this->m_dynamicState).pNext = pvVar3;
  (this->m_dynamicState).pDynamicStates =
       (this->m_dynamicStates).
       super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->super_VkGraphicsPipelineCreateInfo).pDynamicState = &this->m_dynamicState;
  return this;
}

Assistant:

PipelineCreateInfo& PipelineCreateInfo::addState (const vk::VkPipelineDynamicStateCreateInfo& state)
{
	m_dynamicStates					= std::vector<vk::VkDynamicState>(state.pDynamicStates, state.pDynamicStates + state.dynamicStateCount);
	m_dynamicState					= state;
	m_dynamicState.pDynamicStates	= &m_dynamicStates[0];
	pDynamicState					= &m_dynamicState;

	return *this;
}